

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ATTRIBUTE *pAVar6;
  undefined1 *puVar7;
  long lVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  
  pAVar6 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar6 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar9 = 0;
  pbVar11 = (byte *)ptr;
  iVar10 = iVar9;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (pAVar6 == (ATTRIBUTE *)0x1) {
        return -2;
      }
      iVar3 = (*enc[3].nameLength)(enc,ptr);
      if (iVar3 == 0) {
        iVar3 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar6->name);
        goto LAB_006d706e;
      }
    }
    else if (bVar1 == 6) {
      if (pAVar6 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar5 = (*enc[3].skipS)(enc,ptr);
      if ((int)pcVar5 == 0) {
        iVar3 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,&pAVar6->name);
        goto LAB_006d7043;
      }
    }
    else {
      iVar10 = 0;
      if (bVar1 == 7) {
        if (pAVar6 < (ATTRIBUTE *)0x4) {
          return -2;
        }
        iVar3 = (*enc[3].getAtts)(enc,ptr,7,pAVar6);
        iVar10 = iVar9;
        if (iVar3 == 0) {
          iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX,(char *)pAVar6);
          while( true ) {
            lVar8 = 4;
            while( true ) {
              while( true ) {
                pbVar11 = (byte *)ptr;
                iVar10 = iVar9;
                if (iVar3 == 0) goto LAB_006d707b;
LAB_006d6f93:
                while( true ) {
                  ptr = (char *)((byte *)ptr + lVar8);
                  uVar4 = (long)end - (long)ptr;
                  if ((long)uVar4 < 1) {
                    return -1;
                  }
                  pAVar6 = (ATTRIBUTE *)(ulong)(byte)*ptr;
                  bVar1 = *(byte *)((long)&pAVar6->name + (long)enc[1].scanners);
                  pbVar11 = (byte *)ptr;
                  if (bVar1 < 0x12) break;
                  lVar8 = 1;
                  if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                    iVar10 = iVar9;
                    if (bVar1 == 0x12) {
                      pbVar11 = (byte *)ptr + 1;
                      iVar10 = 9;
                    }
                    goto LAB_006d707b;
                  }
                }
                if (bVar1 != 5) break;
                if (uVar4 == 1) {
                  return -2;
                }
                iVar3 = (*enc[3].nameLength)(enc,ptr);
                iVar10 = iVar9;
                if (iVar3 != 0) goto LAB_006d707b;
                iVar3 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,&pAVar6->name);
LAB_006d706e:
                lVar8 = 2;
              }
              if (bVar1 != 6) break;
              if (uVar4 < 3) {
                return -2;
              }
              pcVar5 = (*enc[3].skipS)(enc,ptr);
              iVar10 = iVar9;
              if ((int)pcVar5 != 0) goto LAB_006d707b;
              iVar3 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_03,&pAVar6->name);
LAB_006d7043:
              lVar8 = 3;
            }
            iVar10 = iVar9;
            if (bVar1 != 7) break;
            if (uVar4 < 4) {
              return -2;
            }
            iVar3 = (*enc[3].getAtts)(enc,ptr,(uint)bVar1,pAVar6);
            if (iVar3 != 0) break;
            iVar3 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_02,&pAVar6->name);
          }
        }
      }
    }
  }
  else if (bVar1 == 0x13) {
    pbVar11 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar11 || (long)end - (long)pbVar11 < 0) {
      return -1;
    }
    if ((ulong)*pbVar11 == 0x78) {
      pbVar11 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar11 || (long)end - (long)pbVar11 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar11) & 0xfe) != 0x18) goto LAB_006d707b;
      pbVar11 = (byte *)(ptr + 3);
      lVar8 = (long)end - (long)pbVar11;
      while( true ) {
        if (lVar8 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
        if (1 < bVar1 - 0x18) break;
        pbVar11 = pbVar11 + 1;
        lVar8 = lVar8 + -1;
      }
      if (bVar1 != 0x12) goto LAB_006d707b;
      pbVar12 = pbVar11 + 1;
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*pbVar11) != '\x19') goto LAB_006d707b;
      puVar7 = &pAVar6[-1].field_0x1e;
      pbVar12 = (byte *)(ptr + 2);
      do {
        pbVar11 = pbVar12;
        if ((long)puVar7 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar11);
        pbVar12 = pbVar11 + 1;
        puVar7 = puVar7 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_006d707b;
    }
    pbVar11 = pbVar12;
    iVar10 = 10;
  }
  else {
    lVar8 = 1;
    if (bVar1 == 0x16) goto LAB_006d6f93;
    if (bVar1 == 0x18) goto LAB_006d6f93;
  }
LAB_006d707b:
  *nextTokPtr = (char *)pbVar11;
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}